

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcast_unsigned_converters.hpp
# Opt level: O2

bool __thiscall
boost::detail::lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
          (lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *this)

{
  uint *puVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  locale *plVar7;
  numpunct *pnVar8;
  char *pcVar9;
  byte bVar10;
  locale loc;
  locale alStack_58 [8];
  char *local_50;
  long local_48;
  
  puVar1 = this->m_value;
  pcVar2 = this->m_end;
  pcVar9 = pcVar2 + -1;
  this->m_end = pcVar9;
  *puVar1 = 0;
  if ((pcVar9 < this->m_begin) || ((byte)(*pcVar9 - 0x3aU) < 0xf6)) {
    bVar4 = false;
  }
  else {
    *puVar1 = (uint)(byte)(*pcVar9 - 0x30);
    this->m_end = pcVar2 + -2;
    std::locale::locale(alStack_58);
    plVar7 = (locale *)std::locale::classic();
    cVar3 = std::locale::operator==(alStack_58,plVar7);
    if (cVar3 == '\0') {
      pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>(alStack_58);
      (**(code **)(*(long *)pnVar8 + 0x20))(&local_50,pnVar8);
      if ((local_48 == 0) || (*local_50 < '\x01')) {
LAB_001afce4:
        bVar4 = main_convert_loop(this);
      }
      else {
        cVar5 = (**(code **)(*(long *)pnVar8 + 0x18))(pnVar8);
        cVar3 = *local_50 + -1;
        pcVar9 = this->m_end;
        bVar10 = 0;
        while( true ) {
          bVar4 = pcVar9 < this->m_begin;
          if (bVar4) break;
          if (cVar3 == '\0') {
            if (*pcVar9 != cVar5) goto LAB_001afce4;
            if (this->m_begin == pcVar9) break;
            bVar10 = bVar10 + ((ulong)bVar10 < local_48 - 1U);
            cVar3 = local_50[bVar10];
          }
          else {
            bVar6 = main_convert_iteration(this);
            if (!bVar6) break;
            cVar3 = cVar3 + -1;
            pcVar9 = this->m_end;
          }
          pcVar9 = pcVar9 + -1;
          this->m_end = pcVar9;
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar4 = main_convert_loop(this);
    }
    std::locale::~locale(alStack_58);
  }
  return bVar4;
}

Assistant:

inline bool convert() {
                CharT const czero = lcast_char_constants<CharT>::zero;
                --m_end;
                m_value = static_cast<T>(0);

                if (m_begin > m_end || *m_end < czero || *m_end >= czero + 10)
                    return false;
                m_value = static_cast<T>(*m_end - czero);
                --m_end;

#ifdef BOOST_LEXICAL_CAST_ASSUME_C_LOCALE
                return main_convert_loop();
#else
                std::locale loc;
                if (loc == std::locale::classic()) {
                    return main_convert_loop();
                }

                typedef std::numpunct<CharT> numpunct;
                numpunct const& np = BOOST_USE_FACET(numpunct, loc);
                std::string const& grouping = np.grouping();
                std::string::size_type const grouping_size = grouping.size();

                /* According to Programming languages - C++
                 * we MUST check for correct grouping
                 */
                if (!grouping_size || grouping[0] <= 0) {
                    return main_convert_loop();
                }

                unsigned char current_grouping = 0;
                CharT const thousands_sep = np.thousands_sep();
                char remained = static_cast<char>(grouping[current_grouping] - 1);

                for (;m_end >= m_begin; --m_end)
                {
                    if (remained) {
                        if (!main_convert_iteration()) {
                            return false;
                        }
                        --remained;
                    } else {
                        if ( !Traits::eq(*m_end, thousands_sep) ) //|| begin == end ) return false;
                        {
                            /*
                             * According to Programming languages - C++
                             * Digit grouping is checked. That is, the positions of discarded
                             * separators is examined for consistency with
                             * use_facet<numpunct<charT> >(loc ).grouping()
                             *
                             * BUT what if there is no separators at all and grouping()
                             * is not empty? Well, we have no extraced separators, so we
                             * won`t check them for consistency. This will allow us to
                             * work with "C" locale from other locales
                             */
                            return main_convert_loop();
                        } else {
                            if (m_begin == m_end) return false;
                            if (current_grouping < grouping_size - 1) ++current_grouping;
                            remained = grouping[current_grouping];
                        }
                    }
                } /*for*/

                return true;
#endif
            }